

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O3

int iniparser_getsecnkeys(dictionary *d,char *s)

{
  long lVar1;
  char **ppcVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  int iVar6;
  long lVar7;
  char keym [1025];
  char acStack_438 [1032];
  
  iVar6 = 0;
  if (d != (dictionary *)0x0) {
    pcVar4 = iniparser_getstring(d,s,(char *)0xffffffffffffffff);
    iVar6 = 0;
    if (pcVar4 != (char *)0xffffffffffffffff) {
      sVar5 = strlen(s);
      strlwc(s,acStack_438,0x401);
      acStack_438[(int)sVar5] = ':';
      lVar1 = d->size;
      if (0 < lVar1) {
        ppcVar2 = d->key;
        lVar7 = 0;
        iVar6 = 0;
        do {
          if (ppcVar2[lVar7] != (char *)0x0) {
            iVar3 = strncmp(ppcVar2[lVar7],acStack_438,(long)((sVar5 << 0x20) + 0x100000000) >> 0x20
                           );
            iVar6 = iVar6 + (uint)(iVar3 == 0);
          }
          lVar7 = lVar7 + 1;
        } while (lVar1 != lVar7);
      }
    }
  }
  return iVar6;
}

Assistant:

int iniparser_getsecnkeys(const dictionary * d, const char * s)
{
    int     seclen, nkeys ;
    char    keym[ASCIILINESZ + 1];
    int j ;

    nkeys = 0;

    if (d == NULL) return nkeys;
    if (! iniparser_find_entry(d, s)) return nkeys;

    seclen  = (int)strlen(s);
    strlwc(s, keym, sizeof(keym));
    keym[seclen] = ':';

    for (j = 0 ; j < d->size ; j++) {
        if (d->key[j] == NULL)
            continue ;
        if (!strncmp(d->key[j], keym, seclen + 1))
            nkeys++;
    }

    return nkeys;

}